

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::become_follower(raft_server *this)

{
  bool bVar1;
  int iVar2;
  __int_type_conflict _Var3;
  element_type *peVar4;
  ulong uVar5;
  atomic<bool> *this_00;
  long in_RDI;
  raft_server *in_stack_00000020;
  uint64_t my_term;
  Param param;
  peer_itor it;
  lock_guard<std::mutex> ll;
  raft_server *in_stack_00000140;
  undefined4 in_stack_ffffffffffffff58;
  srv_role in_stack_ffffffffffffff5c;
  undefined1 __i;
  peer *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int32_t my_id;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff70;
  atomic<bool> *local_78;
  Param local_70;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_58;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48 [4];
  string local_28 [40];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x250292);
    iVar2 = (*peVar4->_vptr_logger[7])();
    if (3 < iVar2) {
      in_stack_ffffffffffffff70 =
           (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2502b5);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2502cb);
      uVar5 = srv_state::get_term((srv_state *)0x2502d3);
      msg_if_given_abi_cxx11_((char *)local_28,"[BECOME FOLLOWER] term %lu",uVar5);
      (**(code **)((long)&(in_stack_ffffffffffffff70->_M_ptr->rpc_protector_).super___mutex_base.
                          _M_mutex + 0x10))
                (in_stack_ffffffffffffff70,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_follower",0x525,local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_ffffffffffffff60,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while( true ) {
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar1 = std::__detail::operator!=(local_48,&local_58);
    if (!bVar1) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x2503be);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2503ca);
    peer::enable_hb(in_stack_ffffffffffffff60,SUB41(in_stack_ffffffffffffff5c >> 0x18,0));
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_ffffffffffffff60);
  }
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffff70);
  std::atomic<nuraft::srv_role>::operator=
            ((atomic<nuraft::srv_role> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  my_id = *(int32_t *)(in_RDI + 0x38);
  _Var3 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)CONCAT44(my_id,in_stack_ffffffffffffff68));
  cb_func::Param::Param(&local_70,my_id,_Var3,-1,(void *)0x0);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x25046a);
  this_00 = (atomic<bool> *)srv_state::get_term((srv_state *)0x250472);
  local_70.ctx = &local_78;
  local_78 = this_00;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x25049e);
  cb_func::call((cb_func *)CONCAT44(my_id,in_stack_ffffffffffffff68),(Type)((ulong)this_00 >> 0x20),
                (Param *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __i = 0;
  std::atomic<bool>::operator=(this_00,false);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(my_id,in_stack_ffffffffffffff68),
             (__int_type_conflict)((ulong)this_00 >> 0x20));
  std::atomic<bool>::operator=(this_00,(bool)__i);
  _Var3 = (__int_type_conflict)((ulong)this_00 >> 0x20);
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_ffffffffffffff70);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(my_id,in_stack_ffffffffffffff68),_Var3);
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(my_id,in_stack_ffffffffffffff68),_Var3);
  drop_all_pending_commit_elems(in_stack_00000140);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x250547);
  restart_election_timer(in_stack_00000020);
  return;
}

Assistant:

void raft_server::become_follower() {
    // stop hb for all peers
    p_in("[BECOME FOLLOWER] term %" PRIu64 "", state_->get_term());
    {   std::lock_guard<std::mutex> ll(cli_lock_);
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            it->second->enable_hb(false);
        }

        srv_to_join_.reset();
        role_ = srv_role::follower;

        cb_func::Param param(id_, leader_);
        uint64_t my_term = state_->get_term();
        param.ctx = &my_term;
        (void) ctx_->cb_func_.call(cb_func::BecomeFollower, &param);

        write_paused_ = false;
        next_leader_candidate_ = -1;
        initialized_ = true;
        uncommitted_config_.reset();
        pre_vote_.quorum_reject_count_ = 0;
        pre_vote_.failure_count_ = 0;

        // Drain all pending callback functions.
        drop_all_pending_commit_elems();
    }

    restart_election_timer();
}